

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O0

void duckdb::RemapStructFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  BoundFunctionExpression *this;
  RemapStructBindData *pRVar2;
  reference count;
  reference this_00;
  DataChunk *in_RDX;
  BaseExpression *in_RSI;
  DataChunk *in_RDI;
  value_type *input;
  RemapStructBindData *info;
  BoundFunctionExpression *func_expr;
  vector<duckdb::RemapColumnInfo,_true> *in_stack_00000150;
  idx_t in_stack_00000158;
  Vector *in_stack_00000160;
  Vector *in_stack_00000168;
  Vector *in_stack_00000170;
  size_type in_stack_ffffffffffffffa8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffb0;
  VectorType vector_type_p;
  
  this = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_RSI);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffffb0);
  pRVar2 = FunctionData::Cast<duckdb::RemapStructBindData>
                     ((FunctionData *)in_stack_ffffffffffffffb0);
  vector_type_p = (VectorType)((ulong)pRVar2 >> 0x38);
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = vector<duckdb::Vector,_true>::operator[]
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  DataChunk::size(in_RDI);
  RemapStruct(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
              in_stack_00000150);
  bVar1 = DataChunk::AllConstant(in_RDX);
  if (bVar1) {
    Vector::SetVectorType((Vector *)this,vector_type_p);
  }
  DataChunk::size(in_RDI);
  Vector::Verify(this_00,(idx_t)count);
  return;
}

Assistant:

static void RemapStructFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RemapStructBindData>();

	auto &input = args.data[0];

	RemapStruct(input, args.data[3], result, args.size(), info.remap_info);
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(args.size());
}